

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformChoice(Impl *this,AtomSpan *atoms)

{
  uint32 uVar1;
  uint *puVar2;
  Span<unsigned_int> *in_RSI;
  LitSpan *in_RDI;
  Span<int> SVar3;
  iterator end;
  iterator it;
  Atom_t hAux;
  LitSpan bAux;
  Lit_t bLit;
  uint32 nRule;
  Impl *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined1 auVar4 [12];
  uint *local_38;
  int local_18;
  uint32 local_14;
  Span<unsigned_int> *local_10;
  
  local_14 = 0;
  local_18 = 0;
  local_10 = in_RSI;
  Potassco::toSpan<int>(&local_18,1);
  local_38 = Potassco::begin<unsigned_int>(local_10);
  puVar2 = Potassco::end<unsigned_int>((Span<unsigned_int> *)0x19e33a);
  for (; local_38 != puVar2; local_38 = local_38 + 1) {
    newAtom(in_stack_ffffffffffffff90);
    local_18 = Potassco::neg(0);
    in_stack_ffffffffffffff90 = (Impl *)(in_RDI + 1);
    Potassco::neg(0);
    bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
              ((pod_vector<int,_std::allocator<int>_> *)in_RDI,
               (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    in_stack_ffffffffffffff9c = *local_38;
    SVar3 = Potassco::toSpan<bk_lib::pod_vector<int,std::allocator<int>>>
                      ((pod_vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90);
    auVar4 = SVar3._4_12_;
    uVar1 = addRule((Impl *)SVar3.size,SVar3.first._4_4_,in_RDI);
    local_14 = uVar1 + local_14;
    uVar1 = addRule(auVar4._4_8_,auVar4._0_4_,in_RDI);
    local_14 = uVar1 + local_14;
    bk_lib::pod_vector<int,_std::allocator<int>_>::pop_back
              ((pod_vector<int,_std::allocator<int>_> *)(in_RDI + 1));
  }
  return local_14;
}

Assistant:

uint32 RuleTransform::Impl::transformChoice(const Potassco::AtomSpan& atoms) {
	uint32 nRule = 0;
	Potassco::Lit_t   bLit = 0;
	Potassco::LitSpan bAux = Potassco::toSpan(&bLit, 1);
	Atom_t hAux;
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms), end = Potassco::end(atoms); it != end; ++it) {
		hAux = newAtom();
		bLit = Potassco::neg(*it);
		lits_.push_back(Potassco::neg(hAux));
		nRule += addRule(*it, Potassco::toSpan(lits_));
		nRule += addRule(hAux, bAux);
		lits_.pop_back();
	}
	return nRule;
}